

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void modifyDeepChannels<float>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
               *channels,float delta)

{
  uint uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  _List_node_base *p_Var10;
  
  for (p_Var2 = (channels->
                super__List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)channels;
      p_Var2 = (((_List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var3 = p_Var2[1]._M_next;
    if (0 < (long)p_Var3) {
      p_Var4 = p_Var2[1]._M_prev;
      lVar5 = sampleCount->_sizeY;
      puVar6 = sampleCount->_data;
      p_Var8 = (_List_node_base *)0x0;
      do {
        if (0 < (long)p_Var4) {
          p_Var10 = (_List_node_base *)0x0;
          do {
            uVar1 = puVar6[(long)((long)&p_Var10->_M_next + lVar5 * (long)p_Var8)];
            if ((ulong)uVar1 != 0) {
              lVar7 = *(long *)(*(long *)(p_Var2 + 1 + 1) +
                               (long)((long)&p_Var10->_M_next + (long)p_Var4 * (long)p_Var8) * 8);
              uVar9 = 0;
              do {
                *(float *)(lVar7 + uVar9 * 4) = *(float *)(lVar7 + uVar9 * 4) + delta;
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
            p_Var10 = (_List_node_base *)((long)&p_Var10->_M_next + 1);
          } while (p_Var10 != p_Var4);
        }
        p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
      } while (p_Var8 != p_Var3);
    }
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}